

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O2

double testExtendedKalmanFilterLTV(void)

{
  Scalar SVar1;
  double *pdVar2;
  double dVar3;
  result_type rVar4;
  RealScalar RVar5;
  Index IVar6;
  int iVar7;
  long lVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  ulong uVar11;
  MeasureVector *pMVar12;
  uint uVar13;
  long lVar14;
  InputVector *pIVar15;
  bool bVar16;
  StateVector xh;
  StateVector error;
  normal_distribution<double> g;
  Pmatrix p;
  StateVector x;
  StateVector dx;
  Rmatrix r;
  Qmatrix q1;
  double *local_e470;
  Index IStack_e468;
  Qmatrix q;
  KalmanFunctorLTV func;
  Rmatrix r1;
  InputVector uk [1001];
  StateVector xk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  
  if (testExtendedKalmanFilterLTV()::f == '\0') {
    iVar7 = __cxa_guard_acquire(&testExtendedKalmanFilterLTV()::f);
    if (iVar7 != 0) {
      stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
                ((ExtendedKalmanFilter *)testExtendedKalmanFilterLTV()::f,4,3,1,true,true);
      __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                   testExtendedKalmanFilterLTV()::f,&__dso_handle);
      __cxa_guard_release(&testExtendedKalmanFilterLTV()::f);
    }
  }
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            (&func.super_DynamicalSystemFunctorBase);
  func._0_8_ = &PTR__KalmanFunctorLTV_00125c60;
  func.a.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  func.a.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  func.a.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func.c.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  func.c.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  func.c.
  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::aligned_allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  stateObservation::ObserverBase::stateVectorRandom();
  IVar6 = func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar2 = func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar2;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar6;
  free(pdVar2);
  stateObservation::ObserverBase::measureVectorRandom();
  IVar6 = func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar2 = func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar2;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar6;
  free(pdVar2);
  lVar14 = 0x3e9;
  while (bVar16 = lVar14 != 0, lVar14 = lVar14 + -1, bVar16) {
    stateObservation::KalmanFilterBase::getAmatrixRandom();
    gen_.i = 0;
    gen_._4_4_ = 0x3fe00000;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)xk,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)yk,(double *)&gen_);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)uk,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)xk);
    std::
    vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::aligned_allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::emplace_back<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)&func.a,(Matrix<double,__1,__1,_0,__1,__1> *)uk);
    free(uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    stateObservation::KalmanFilterBase::getCmatrixRandom();
    std::
    vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::aligned_allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::emplace_back<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)&func.c,(Matrix<double,__1,__1,_0,__1,__1> *)xk);
    free(xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterLTV()::f);
  memset(xk,0,0x3e90);
  memset(yk,0,16000);
  memset(uk,0,0x3e90);
  stateObservation::ObserverBase::stateVectorZero();
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed(&gen_);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,(double *)&r);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&g);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r,(double *)&q);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&g);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&r1;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&q);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&r,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&g);
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&q1;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&p);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&q,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&g);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(xk,&x);
  stateObservation::ObserverBase::inputVectorRandom();
  IVar6 = uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar2 = uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)g._mean;
  uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)g._sigma;
  g._sigma = (double)IVar6;
  g._mean = (double)pdVar2;
  free(pdVar2);
  for (lVar14 = 1; lVar14 != 0x3e9; lVar14 = lVar14 + 1) {
    stateObservation::ObserverBase::stateVectorZero();
    uVar13 = 0;
    while( true ) {
      lVar8 = stateObservation::ObserverBase::getStateSize();
      if (lVar8 <= (long)(ulong)uVar13) break;
      error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x3ff0000000000000;
      boost::random::normal_distribution<double>::normal_distribution
                (&g,(double *)&error,(double *)&xh);
      rVar4 = boost::random::normal_distribution<double>::operator()(&g,&gen_);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&p,
                          (ulong)uVar13);
      *pSVar9 = rVar4;
      uVar13 = uVar13 + 1;
    }
    g = (normal_distribution<double>)
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&p,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)&g);
    stateObservation::ObserverBase::measureVectorZero();
    uVar13 = 0;
    while( true ) {
      lVar8 = stateObservation::ObserverBase::getMeasureSize();
      if (lVar8 <= (long)(ulong)uVar13) break;
      xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x3ff0000000000000;
      boost::random::normal_distribution<double>::normal_distribution
                (&g,(double *)&xh,(double *)&dx);
      rVar4 = boost::random::normal_distribution<double>::operator()(&g,&gen_);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,
                          (ulong)uVar13);
      *pSVar9 = rVar4;
      uVar13 = uVar13 + 1;
    }
    g = (normal_distribution<double>)
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&error,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)&g);
    stateObservation::ObserverBase::inputVectorRandom();
    pdVar2 = uk[lVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    dVar3 = (double)uk[lVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
    uk[lVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)g._mean;
    uk[lVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)g._sigma;
    g._sigma = dVar3;
    g._mean = (double)pdVar2;
    free(pdVar2);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,(StateVector *)&func,&x,
               (TimeIndex)(uk + lVar14 + -1));
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (&x,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&g);
    free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (xk + lVar14,&x);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,(StateVector *)&func,&x,
               (TimeIndex)(uk + lVar14));
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (yk + lVar14 + -1,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&g);
    free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState
            ((Matrix *)testExtendedKalmanFilterLTV()::f,(long)&xh);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  uVar13 = 0;
  while( true ) {
    lVar14 = stateObservation::ObserverBase::getStateSize();
    uVar11 = (ulong)uVar13;
    if (lVar14 <= (long)uVar11) break;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xh,uVar11);
    SVar1 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&p,uVar11,
                         uVar11);
    *pSVar10 = SVar1;
    uVar13 = uVar13 + 1;
  }
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&p;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&p,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&error)
  ;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&p,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&g);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)testExtendedKalmanFilterLTV()::f)
  ;
  stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilterLTV()::f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilterLTV()::f);
  uVar13 = 0;
  stateObservation::ZeroDelayObserver::setInput((Matrix *)testExtendedKalmanFilterLTV()::f,(long)uk)
  ;
  while( true ) {
    lVar14 = stateObservation::ObserverBase::getStateSize();
    uVar11 = (ulong)uVar13;
    if (lVar14 <= (long)uVar11) break;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xh,uVar11);
    SVar1 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&p,uVar11,
                         uVar11);
    *pSVar10 = SVar1;
    uVar13 = uVar13 + 1;
  }
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&p;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&p,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&error)
  ;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&p,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&g);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  local_e470 = (double *)0x3e45798ee2308c3a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,(double *)&local_e470);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&dx,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&g);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  pIVar15 = uk;
  pMVar12 = yk;
  for (lVar14 = 1; pIVar15 = pIVar15 + 1, lVar14 != 0x3e9; lVar14 = lVar14 + 1) {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)testExtendedKalmanFilterLTV()::f,(long)pMVar12);
    stateObservation::ZeroDelayObserver::setInput
              ((Matrix *)testExtendedKalmanFilterLTV()::f,(long)pIVar15);
    stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&g);
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&error);
    stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilterLTV()::f);
    stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilterLTV()::f);
    stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_e470);
    IVar6 = xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar2 = xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_e470;
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IStack_e468
    ;
    local_e470 = pdVar2;
    IStack_e468 = IVar6;
    free(pdVar2);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free((void *)g._mean);
    pMVar12 = pMVar12 + 1;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(xk + 1000));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&g);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  lVar14 = 16000;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar14));
    lVar14 = lVar14 + -0x10;
  } while (lVar14 != -0x10);
  lVar14 = 0x3e70;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar14));
    lVar14 = lVar14 + -0x10;
  } while (lVar14 != -0x10);
  lVar14 = 16000;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar14));
    lVar14 = lVar14 + -0x10;
  } while (lVar14 != -0x10);
  testExtendedKalmanFilterLTV::KalmanFunctorLTV::~KalmanFunctorLTV(&func);
  return RVar5;
}

Assistant:

double testExtendedKalmanFilterLTV()
{
  const static stateObservation::TimeIndex kmax = 1000;

  typedef stateObservation::ExtendedKalmanFilter ekf;

  static ekf f(4, 3, 1);

  struct KalmanFunctorLTV : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    KalmanFunctorLTV()
    {
      s_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();

      for(stateObservation::Index i = 0; i <= kmax; ++i)
      {
        a.push_back(f.getAmatrixRandom() * 0.5);
        c.push_back(f.getCmatrixRandom());
      }
    }

    virtual ekf::StateVector stateDynamics(const ekf::StateVector & x,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      ekf::StateVector xk1;
      stateObservation::TimeIndex kk = std::min(k, kmax);
      xk1 = a[kk] * x + (u.transpose() * u)(0, 0) * s_;

      return xk1;
    }

    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & x,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      stateObservation::TimeIndex kk = std::min(k, kmax);
      yk = c[kk] * x + (u.transpose() * u)(0, 0) * n_;
      return yk;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

    std::vector<ekf::Amatrix, Eigen::aligned_allocator<ekf::Amatrix>> a;
    std::vector<ekf::Cmatrix, Eigen::aligned_allocator<ekf::Cmatrix>> c;

  private:
    ekf::StateVector s_;
    ekf::MeasureVector n_;
  };

  KalmanFunctorLTV func;

  f.setFunctor(&func);

  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector uk[kmax + 1];

  ekf::StateVector x = f.stateVectorZero();

  boost::lagged_fibonacci1279 gen_;

  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  xk[0] = x;
  uk[0] = f.inputVectorRandom();

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {
    ekf::StateVector v(f.stateVectorZero());
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    ekf::MeasureVector w(f.measureVectorZero());
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    uk[k] = f.inputVectorRandom();

    x = func.stateDynamics(x, uk[k - 1], k - 1) + v;

    xk[k] = x;
    yk[k - 1] = func.measureDynamics(x, uk[k], k) + w;
  }

  ekf::StateVector xh = f.stateVectorRandom();

  f.setState(xh, 0);

  ekf::Pmatrix p = f.getPmatrixZero();

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  f.setStateCovariance(p);

  f.setR(r);
  f.setQ(q);

  f.setInput(uk[0], 0);

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);
    f.setInput(uk[i], i);

    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    f.setA(a);
    f.setC(c);

    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}